

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall DirectionCone_BoundBounds_Test::TestBody(DirectionCone_BoundBounds_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  byte bVar6;
  char cVar7;
  undefined8 *extraout_RDX;
  Point3<float> *pPVar8;
  int iVar9;
  char *pcVar10;
  char *in_R9;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar19 [32];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  Float t1;
  float fVar62;
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  Float t0;
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  Float radius_2;
  Float radius;
  AssertionResult gtest_ar;
  Float theta;
  Bounds3f b;
  AssertHelper local_160;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  AssertHelper local_150;
  float local_144;
  Bounds3<float> local_140;
  undefined1 local_128 [8];
  float local_120;
  undefined4 uStack_11c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  float local_100;
  float local_fc;
  char local_f8;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  AssertHelper local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ulong local_90;
  undefined1 local_88 [16];
  Bounds3<float> local_70;
  undefined1 local_58 [32];
  undefined1 auVar18 [32];
  
  auVar23._8_4_ = 0x3f800000;
  auVar23._0_8_ = 0x3f8000003f800000;
  auVar23._12_4_ = 0x3f800000;
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_128 = (undefined1  [8])0x0;
  local_120 = 0.0;
  local_70.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar23);
  local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  pbrt::Bounds3<float>::BoundingSphere(&local_70,(Point3<float> *)local_128,(Float *)&local_140);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_128;
  auVar23 = vmovshdup_avx(auVar49);
  fVar20 = 0.2 - auVar23._0_4_;
  auVar23 = ZEXT416((uint)(0.1 - local_128._0_4_));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20)),auVar23,auVar23);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)(0.3 - local_120)),
                            ZEXT416((uint)(0.3 - local_120)));
  if (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x *
      local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x <= auVar23._0_4_) {
    auVar52._0_4_ = local_128._0_4_ + -0.1;
    auVar52._4_4_ = local_128._4_4_ + -0.2;
    auVar52._8_8_ = 0;
    local_100 = local_120 + -0.3;
    auVar58._0_4_ = auVar52._0_4_ * auVar52._0_4_;
    auVar58._4_4_ = auVar52._4_4_ * auVar52._4_4_;
    auVar58._8_8_ = 0;
    auVar23 = vmovshdup_avx(auVar58);
    auVar23 = vfmadd231ss_fma(auVar23,auVar52,auVar52);
    auVar49 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
    auVar23 = vsqrtss_avx(auVar49,auVar49);
    fVar20 = auVar23._0_4_;
    local_100 = local_100 / fVar20;
    auVar33._0_12_ = ZEXT812(0);
    auVar33._12_4_ = 0;
    auVar49 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x *
                                              local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x) /
                                              auVar49._0_4_)),auVar33);
    auVar34._4_4_ = fVar20;
    auVar34._0_4_ = fVar20;
    auVar34._8_4_ = fVar20;
    auVar34._12_4_ = fVar20;
    auVar23 = vdivps_avx(auVar52,auVar34);
    auVar49 = vsqrtss_avx(auVar49,auVar49);
    local_fc = auVar49._0_4_;
    auVar43._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar43._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar43._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar43._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar49 = vmovshdup_avx(auVar43);
    auVar49 = vfmadd231ss_fma(auVar49,auVar23,auVar23);
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
    auVar49 = vsqrtss_avx(auVar49,auVar49);
    fVar20 = auVar49._0_4_;
    auVar44._4_4_ = fVar20;
    auVar44._0_4_ = fVar20;
    auVar44._8_4_ = fVar20;
    auVar44._12_4_ = fVar20;
    auVar23 = vdivps_avx(auVar23,auVar44);
    local_100 = local_100 / fVar20;
  }
  else {
    local_fc = -1.0;
    local_100 = 1.0;
    auVar23 = ZEXT816(0);
  }
  local_108 = vmovlps_avx(auVar23);
  local_f8 = 0;
  local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x = -1.0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_128,"std::cos(Pi)","c.cosTheta",(float *)&local_140,&local_fc);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if ((undefined8 *)CONCAT44(uStack_11c,local_120) == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)CONCAT44(uStack_11c,local_120);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x18d,pcVar10);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_128 = (undefined1  [8])0x0;
  local_120 = 0.0;
  pbrt::Bounds3<float>::BoundingSphere(&local_70,(Point3<float> *)local_128,(Float *)&local_140);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_128;
  auVar23 = vmovshdup_avx(auVar21);
  fVar20 = 0.5 - auVar23._0_4_;
  auVar23 = ZEXT416((uint)(-0.5 - local_128._0_4_));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20)),auVar23,auVar23);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)(0.5 - local_120)),
                            ZEXT416((uint)(0.5 - local_120)));
  if (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x *
      local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x <= auVar23._0_4_) {
    auVar53._0_4_ = local_128._0_4_ + 0.5;
    auVar53._4_4_ = local_128._4_4_ + -0.5;
    auVar53._8_8_ = 0;
    local_100 = local_120 + -0.5;
    auVar45._0_4_ = auVar53._0_4_ * auVar53._0_4_;
    auVar45._4_4_ = auVar53._4_4_ * auVar53._4_4_;
    auVar45._8_8_ = 0;
    auVar23 = vmovshdup_avx(auVar45);
    auVar23 = vfmadd231ss_fma(auVar23,auVar53,auVar53);
    auVar49 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
    auVar23 = vsqrtss_avx(auVar49,auVar49);
    fVar20 = auVar23._0_4_;
    local_100 = local_100 / fVar20;
    auVar35._0_12_ = ZEXT812(0);
    auVar35._12_4_ = 0;
    auVar49 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x *
                                              local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x) /
                                              auVar49._0_4_)),auVar35);
    auVar36._4_4_ = fVar20;
    auVar36._0_4_ = fVar20;
    auVar36._8_4_ = fVar20;
    auVar36._12_4_ = fVar20;
    auVar23 = vdivps_avx(auVar53,auVar36);
    auVar49 = vsqrtss_avx(auVar49,auVar49);
    local_fc = auVar49._0_4_;
    auVar46._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar46._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar46._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar46._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar49 = vmovshdup_avx(auVar46);
    auVar49 = vfmadd231ss_fma(auVar49,auVar23,auVar23);
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
    auVar49 = vsqrtss_avx(auVar49,auVar49);
    fVar20 = auVar49._0_4_;
    auVar47._4_4_ = fVar20;
    auVar47._0_4_ = fVar20;
    auVar47._8_4_ = fVar20;
    auVar47._12_4_ = fVar20;
    auVar23 = vdivps_avx(auVar23,auVar47);
    local_100 = local_100 / fVar20;
  }
  else {
    local_fc = -1.0;
    local_100 = 1.0;
    auVar23 = ZEXT816(0);
  }
  local_108 = vmovlps_avx(auVar23);
  local_f8 = '\0';
  local_ec = acosf(local_fc);
  local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = &DAT_3fee92bc782b6ae8;
  testing::internal::CmpHelperGE<float,double>
            ((internal *)local_128,"theta","1.0001 * precise",&local_ec,(double *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if ((undefined8 *)CONCAT44(uStack_11c,local_120) == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)CONCAT44(uStack_11c,local_120);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x197,pcVar10);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = &DAT_3ff0d04644cccccd;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_128,"theta","1.1 * precise",&local_ec,(double *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if ((undefined8 *)CONCAT44(uStack_11c,local_120) == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)CONCAT44(uStack_11c,local_120);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x19a,pcVar10);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ + 8))();
    }
  }
  uVar14 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar11 = 0xc0afa303d74a164b;
  auVar16 = vpbroadcastq_avx512vl();
  local_58 = vpaddq_avx2(auVar16,_DAT_00613640);
  do {
    auVar33 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar34 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar64._8_4_ = 0x3f7fffff;
    auVar64._0_8_ = 0x3f7fffff3f7fffff;
    auVar64._12_4_ = 0x3f7fffff;
    auVar65._8_4_ = 0x3f800000;
    auVar65._0_8_ = 0x3f8000003f800000;
    auVar65._12_4_ = 0x3f800000;
    local_128 = (undefined1  [8])0x0;
    local_120 = 0.0;
    uVar12 = uVar11 * 0x5851f42d4c957f2d + 0x401;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar11;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar12;
    auVar23 = vpunpcklqdq_avx(auVar22,auVar37);
    uVar13 = uVar12 * 0x5851f42d4c957f2d + 0x401;
    auVar49 = vpsrlvq_avx2(auVar23,auVar33);
    auVar58 = vpsrlvq_avx2(auVar23,auVar34);
    auVar23 = vpsrlq_avx(auVar23,0x3b);
    auVar23 = vpshufd_avx(auVar23,0xe8);
    auVar49 = vpshufd_avx(auVar49 ^ auVar58,0xe8);
    auVar23 = vprorvd_avx512vl(auVar49,auVar23);
    uVar11 = uVar13 * 0x5851f42d4c957f2d + 0x401;
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar24._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar24._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar24._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar24._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    uVar12 = uVar11 * 0x5851f42d4c957f2d + 0x401;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar11;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar12;
    auVar49 = vpunpcklqdq_avx(auVar48,auVar54);
    auVar23 = vminps_avx(auVar24,auVar64);
    auVar44 = vpsrlvq_avx2(auVar49,auVar33);
    auVar52 = vpsrlvq_avx2(auVar49,auVar34);
    auVar49 = vpsrlq_avx(auVar49,0x3b);
    uVar11 = uVar12 * 0x5851f42d4c957f2d + 0x401;
    auVar49 = vpshufd_avx(auVar49,0xe8);
    auVar43 = vsubps_avx(auVar65,auVar23);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar11;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar13;
    auVar58 = vpunpcklqdq_avx(auVar60,auVar57);
    auVar21 = vpsrlvq_avx2(auVar58,auVar33);
    auVar35 = vpsrlvq_avx2(auVar58,auVar34);
    auVar58 = vpsrlq_avx(auVar58,0x3b);
    auVar36 = vfnmadd213ps_fma(auVar43,auVar65,auVar23);
    auVar23 = vpshufd_avx(auVar44 ^ auVar52,0xe8);
    auVar58 = vpshufd_avx(auVar58,0xe8);
    uVar11 = uVar11 * 0x5851f42d4c957f2d + 0x401;
    auVar49 = vprorvd_avx512vl(auVar23,auVar49);
    auVar23 = vpshufd_avx(auVar21 ^ auVar35,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar58);
    uVar5 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
    auVar49 = vcvtudq2ps_avx512vl(auVar49);
    bVar6 = (byte)(uVar11 >> 0x3b);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    uVar11 = uVar11 * 0x5851f42d4c957f2d + 0x401;
    auVar25._0_4_ = auVar49._0_4_ * 2.3283064e-10;
    auVar25._4_4_ = auVar49._4_4_ * 2.3283064e-10;
    auVar25._8_4_ = auVar49._8_4_ * 2.3283064e-10;
    auVar25._12_4_ = auVar49._12_4_ * 2.3283064e-10;
    auVar59._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar59._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar59._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar59._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar23 = vminps_avx(auVar25,auVar64);
    auVar49 = vminps_avx(auVar59,auVar64);
    auVar58 = vsubps_avx(auVar65,auVar23);
    auVar43 = vsubps_avx(auVar65,auVar49);
    auVar44 = vfnmadd213ps_fma(auVar58,auVar65,auVar23);
    auVar43 = vfnmadd213ps_fma(auVar43,auVar65,auVar49);
    auVar23 = vminps_avx(auVar44,auVar36);
    auVar49 = vmovshdup_avx(auVar43);
    local_140.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar23);
    auVar58 = vminss_avx(auVar49,auVar43);
    auVar23 = vmaxps_avx(auVar44,auVar36);
    auVar49 = vmaxss_avx(auVar49,auVar43);
    local_140.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar58._0_4_;
    local_140.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar23);
    auVar23 = vcvtusi2ss_avx512f(in_XMM12,uVar5 >> bVar6 | uVar5 << 0x20 - bVar6);
    local_140.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar49._0_4_;
    auVar23 = vminss_avx(ZEXT416((uint)(auVar23._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    local_a8 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * 4.0)),
                               ZEXT416((uint)(1.0 - auVar23._0_4_)),ZEXT416(0xc0800000));
    uVar12 = uVar11 * 0x5851f42d4c957f2d + 0x401;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar11;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar12;
    auVar23 = vpunpcklqdq_avx(auVar26,auVar38);
    auVar49 = vpsrlvq_avx2(auVar23,auVar33);
    auVar58 = vpsrlvq_avx2(auVar23,auVar34);
    auVar23 = vpsrlq_avx(auVar23,0x3b);
    auVar23 = vpshufd_avx(auVar23,0xe8);
    auVar50._8_4_ = 0x40800000;
    auVar50._0_8_ = 0x4080000040800000;
    auVar50._12_4_ = 0x40800000;
    auVar49 = vpshufd_avx(auVar49 ^ auVar58,0xe8);
    auVar23 = vprorvd_avx512vl(auVar49,auVar23);
    auVar16._0_16_ = vcvtudq2ps_avx512vl(auVar23);
    auVar27._0_4_ = auVar16._0_4_ * 2.3283064e-10;
    auVar27._4_4_ = auVar16._4_4_ * 2.3283064e-10;
    auVar27._8_4_ = auVar16._8_4_ * 2.3283064e-10;
    auVar27._12_4_ = auVar16._12_4_ * 2.3283064e-10;
    auVar23 = vminps_avx(auVar27,auVar64);
    auVar49 = vsubps_avx(auVar65,auVar23);
    auVar28._0_4_ = auVar23._0_4_ * 4.0;
    auVar28._4_4_ = auVar23._4_4_ * 4.0;
    auVar28._8_4_ = auVar23._8_4_ * 4.0;
    auVar28._12_4_ = auVar23._12_4_ * 4.0;
    local_e8 = vfnmadd231ps_fma(auVar28,auVar50,auVar49);
    local_c8 = vmovshdup_avx(local_e8);
    pbrt::Bounds3<float>::BoundingSphere(&local_140,(Point3<float> *)local_128,(Float *)&local_160);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_128;
    local_100 = 1.0;
    auVar23 = vmovshdup_avx(auVar39);
    fVar62 = local_a8._0_4_;
    fVar20 = (float)local_e8._0_4_ - auVar23._0_4_;
    auVar23 = ZEXT416((uint)(fVar62 - local_128._0_4_));
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20)),auVar23,auVar23);
    auVar49 = vfmadd231ss_fma(auVar23,ZEXT416((uint)((float)local_c8._0_4_ - local_120)),
                              ZEXT416((uint)((float)local_c8._0_4_ - local_120)));
    auVar23 = ZEXT816(0);
    local_fc = -1.0;
    if (local_160.data_._0_4_ * local_160.data_._0_4_ <= auVar49._0_4_) {
      local_100 = local_120 - (float)local_c8._0_4_;
      auVar16._0_16_ = vpermt2ps_avx512vl(local_e8,SUB6416(ZEXT464(4),0),local_a8);
      auVar49 = vsubps_avx(auVar39,auVar16._0_16_);
      auVar55._0_4_ = auVar49._0_4_ * auVar49._0_4_;
      auVar55._4_4_ = auVar49._4_4_ * auVar49._4_4_;
      auVar55._8_4_ = auVar49._8_4_ * auVar49._8_4_;
      auVar55._12_4_ = auVar49._12_4_ * auVar49._12_4_;
      auVar23 = vmovshdup_avx(auVar55);
      auVar23 = vfmadd231ss_fma(auVar23,auVar49,auVar49);
      auVar58 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
      auVar23 = vsqrtss_avx(auVar58,auVar58);
      fVar20 = auVar23._0_4_;
      auVar61._4_4_ = fVar20;
      auVar61._0_4_ = fVar20;
      auVar61._8_4_ = fVar20;
      auVar61._12_4_ = fVar20;
      local_100 = local_100 / fVar20;
      auVar23 = vdivps_avx(auVar49,auVar61);
      auVar49 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_160.data_._0_4_ * local_160.data_._0_4_) /
                                                auVar58._0_4_)),ZEXT416(0));
      auVar51._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar51._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar51._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar51._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar58 = vmovshdup_avx(auVar51);
      auVar58 = vfmadd231ss_fma(auVar58,auVar23,auVar23);
      auVar49 = vsqrtss_avx(auVar49,auVar49);
      local_fc = auVar49._0_4_;
      auVar49 = vfmadd231ss_fma(auVar58,ZEXT416((uint)local_100),ZEXT416((uint)local_100));
      auVar49 = vsqrtss_avx(auVar49,auVar49);
      fVar20 = auVar49._0_4_;
      auVar56._4_4_ = fVar20;
      auVar56._0_4_ = fVar20;
      auVar56._8_4_ = fVar20;
      auVar56._12_4_ = fVar20;
      local_100 = local_100 / fVar20;
      auVar23 = vdivps_avx(auVar23,auVar56);
    }
    local_108 = vmovlps_avx(auVar23);
    local_f8 = '\0';
    uVar11 = uVar12 * 0x5851f42d4c957f2d + 0x401;
    local_90 = uVar14;
    if ((fVar62 < local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x) ||
       (local_140.pMax.super_Tuple3<pbrt::Point3,_float>.x < fVar62)) {
LAB_0037240d:
      iVar9 = 0;
      do {
        uVar14 = uVar11 * 0x5851f42d4c957f2d + 0x401;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar11;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar14;
        auVar23 = vpunpcklqdq_avx(auVar40,auVar30);
        auVar49 = vpsrlvq_avx2(auVar23,_DAT_006015b0);
        auVar58 = vpsrlvq_avx2(auVar23,_DAT_006015a0);
        auVar23 = vpsrlq_avx(auVar23,0x3b);
        auVar23 = vpshufd_avx(auVar23,0xe8);
        uVar11 = uVar14 * 0x5851f42d4c957f2d + 0x401;
        auVar49 = vpshufd_avx(auVar58 ^ auVar49,0xe8);
        auVar18._16_16_ = auVar16._16_16_;
        auVar23 = vprorvd_avx512vl(auVar49,auVar23);
        auVar23 = vcvtudq2ps_avx512vl(auVar23);
        auVar2._8_4_ = 0x2f800000;
        auVar2._0_8_ = 0x2f8000002f800000;
        auVar2._12_4_ = 0x2f800000;
        auVar49 = vmulps_avx512vl(auVar23,auVar2);
        auVar3._8_4_ = 0x3f7fffff;
        auVar3._0_8_ = 0x3f7fffff3f7fffff;
        auVar3._12_4_ = 0x3f7fffff;
        uVar14 = vcmpps_avx512vl(auVar49,auVar3,1);
        auVar23 = vmovshdup_avx(auVar49);
        bVar6 = (byte)(uVar14 >> 1);
        auVar18._0_16_ = SUB6416(ZEXT464(0x3f7fffff),0);
        auVar17._4_28_ = auVar18._4_28_;
        auVar17._0_4_ = (uint)(bVar6 & 1) * auVar23._0_4_ + (uint)!(bool)(bVar6 & 1) * 0x3f7fffff;
        local_b8 = vfmadd132ss_fma(auVar17._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000)
                                  );
        auVar23 = vfnmadd213ss_fma(local_b8,local_b8,SUB6416(ZEXT464(0x3f800000),0));
        auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x20);
        auVar23 = vsqrtss_avx(auVar23,auVar23);
        local_144 = auVar23._0_4_;
        auVar19._16_16_ = auVar18._16_16_;
        auVar19._0_16_ = SUB6416(ZEXT464(0x40c90fda),0);
        auVar16._4_28_ = auVar19._4_28_;
        auVar16._0_4_ =
             (float)((uint)((byte)uVar14 & 1) * (int)(auVar49._0_4_ * 6.2831855) +
                    (uint)!(bool)((byte)uVar14 & 1) * 0x40c90fda);
        local_88 = auVar16._0_16_;
        local_f0 = cosf(auVar16._0_4_);
        local_f0 = local_f0 * local_144;
        fVar20 = sinf((float)local_88._0_4_);
        local_144 = fVar20 * local_144;
        auVar63 = ZEXT464(0x7f800000);
        auVar23 = ZEXT816(0) << 0x40;
        bVar4 = false;
        uVar5 = 0;
        do {
          auVar49 = ZEXT416((uint)((1.0 / local_f0) *
                                  (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.x -
                                  (float)local_a8._0_4_)));
          pPVar8 = &local_140.pMax;
          fVar20 = 1.0 / local_f0;
          fVar62 = (float)local_a8._0_4_;
          if ((uVar5 != 0) &&
             (auVar49 = ZEXT416((uint)((1.0 / local_144) *
                                      (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.y -
                                      (float)local_e8._0_4_))),
             pPVar8 = (Point3<float> *)((long)&local_140.pMax.super_Tuple3<pbrt::Point3,_float> + 4)
             , fVar20 = 1.0 / local_144, fVar62 = (float)local_e8._0_4_, uVar5 != 1)) {
            auVar49 = ZEXT416((uint)((1.0 / (float)local_b8._0_4_) *
                                    (local_140.pMin.super_Tuple3<pbrt::Point3,_float>.z -
                                    (float)local_c8._0_4_)));
            pPVar8 = (Point3<float> *)((long)&local_140.pMax.super_Tuple3<pbrt::Point3,_float> + 8);
            fVar20 = 1.0 / (float)local_b8._0_4_;
            fVar62 = (float)local_c8._0_4_;
          }
          auVar33 = ZEXT416((uint)(((pPVar8->super_Tuple3<pbrt::Point3,_float>).x - fVar62) * fVar20
                                  ));
          auVar58 = vminss_avx(auVar33,auVar49);
          auVar49 = vmaxss_avx(auVar49,auVar33);
          auVar23 = vmaxss_avx(auVar58,auVar23);
          auVar49 = vminss_avx(ZEXT416((uint)(auVar49._0_4_ * 1.0000004)),auVar63._0_16_);
          auVar63 = ZEXT1664(auVar49);
          if (auVar49._0_4_ < auVar23._0_4_) {
            cVar7 = '\x01';
            if (!bVar4) goto LAB_0037273e;
            break;
          }
          bVar4 = 1 < uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
        if (local_f8 == '\x01') {
          local_160.data_._0_4_ = (float)((uint)local_160.data_._1_3_ << 8);
LAB_0037268d:
          local_158.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_128,(internal *)&local_160,(AssertionResult *)"Inside(c, w)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1b3,(char *)local_128);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_128 != (undefined1  [8])&local_118) {
            operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
          }
          if (((local_150.data_ != (AssertHelperData *)0x0) &&
              (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
             (local_150.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_150.data_ + 8))();
          }
        }
        else {
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_144 * local_144)),ZEXT416((uint)local_f0),
                                    ZEXT416((uint)local_f0));
          auVar23 = vfmadd231ss_fma(auVar23,local_b8,local_b8);
          auVar23 = vsqrtss_avx(auVar23,auVar23);
          fVar20 = auVar23._0_4_;
          auVar41._0_4_ = local_f0 / fVar20;
          auVar41._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar31._0_4_ = (float)local_b8._0_4_ / fVar20;
          auVar31._4_12_ = local_b8._4_12_;
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)((local_144 / fVar20) * local_108._4_4_)),auVar41,
                                    ZEXT416((uint)local_108));
          auVar23 = vfmadd231ss_fma(auVar23,auVar31,ZEXT416((uint)local_100));
          bVar4 = local_fc <= auVar23._0_4_;
          local_160.data_._0_4_ = (float)CONCAT31(local_160.data_._1_3_,bVar4);
          local_158.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar4) goto LAB_0037268d;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_158,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        cVar7 = '\0';
LAB_0037273e:
        if (local_f8 == '\0') {
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_144 * local_144)),ZEXT416((uint)local_f0),
                                    ZEXT416((uint)local_f0));
          auVar23 = vfmadd231ss_fma(auVar23,local_b8,local_b8);
          auVar23 = vsqrtss_avx(auVar23,auVar23);
          fVar20 = auVar23._0_4_;
          auVar42._0_4_ = local_f0 / fVar20;
          auVar42._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar32._0_4_ = local_b8._0_4_ / fVar20;
          auVar32._4_12_ = local_b8._4_12_;
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)((local_144 / fVar20) * local_108._4_4_)),auVar42,
                                    ZEXT416((uint)local_108));
          auVar23 = vfmadd231ss_fma(auVar23,auVar32,ZEXT416((uint)local_100));
          if (auVar23._0_4_ < local_fc) goto LAB_00372798;
        }
        else {
LAB_00372798:
          local_160.data_._0_4_ = (float)CONCAT31(local_160.data_._1_3_,cVar7);
          local_158.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (cVar7 == '\0') {
            testing::Message::Message((Message *)&local_150);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_128,(internal *)&local_160,(AssertionResult *)"hit","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                       ,0x1b5,(char *)local_128);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_150);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            if (local_128 != (undefined1  [8])&local_118) {
              operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
            }
            if (((local_150.data_ != (AssertHelperData *)0x0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               (local_150.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_150.data_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_158,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != 1000);
    }
    else {
      auVar29._8_8_ = local_e8._0_8_;
      auVar29._0_8_ = local_e8._0_8_;
      auVar16._0_16_ = vgatherqps_avx512vl(*extraout_RDX);
      uVar15 = vcmpps_avx512vl(auVar29,auVar16._0_16_,2);
      uVar1 = vcmpps_avx512vl(auVar16._0_16_,auVar29,2);
      auVar23 = vpmovm2d_avx512vl(uVar1);
      auVar49 = vpmovm2d_avx512vl(uVar15);
      auVar23 = vpblendd_avx2(auVar49,auVar23,0xc);
      uVar15 = vpmovd2m_avx512vl(auVar23);
      if ((~(ushort)uVar15 & 0xf) != 0) goto LAB_0037240d;
      local_160.data_._0_4_ = -1.0;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_128,"std::cos(Pi)","c.cosTheta",(float *)&local_160,&local_fc);
      if (local_128[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        pcVar10 = "";
        if ((undefined8 *)CONCAT44(uStack_11c,local_120) != (undefined8 *)0x0) {
          pcVar10 = *(char **)CONCAT44(uStack_11c,local_120);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                   ,0x1a9,pcVar10);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if (((CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != 0) &&
            (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
           ((long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar5 = (int)local_90 + 1;
    uVar14 = (ulong)uVar5;
    if (uVar5 == 1000) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DirectionCone, BoundBounds) {
    Bounds3f b(Point3f(0, 0, 0), Point3f(1, 1, 1));

    // Point inside the bbox
    DirectionCone c = BoundSubtendedDirections(b, Point3f(.1, .2, .3));
    EXPECT_EQ(std::cos(Pi), c.cosTheta);

    // Outside, .5 units away in the middle (so using the direction to the
    // center gives the best bound).
    //
    // tan theta = (sqrt(.5^2 + .5^2)) / .5
    c = BoundSubtendedDirections(b, Point3f(-.5, .5, .5));
    Float theta = std::acos(c.cosTheta);
    Float precise = std::atan(std::sqrt(.5 * .5 + .5 * .5) / .5);
    // Make sure the returned bound isn't too small.
    EXPECT_GE(theta, 1.0001 * precise);
    // It's fine for it to be a bit big (as it is in practice due to
    // approximations for performance), but it shouldn't be too big.
    EXPECT_LT(theta, 1.1 * precise);

    RNG rng(512);
    for (int i = 0; i < 1000; ++i) {
        Bounds3f b(
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)),
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)));

        Point3f p(Lerp(rng.Uniform<Float>(), -4, 4), Lerp(rng.Uniform<Float>(), -4, 4),
                  Lerp(rng.Uniform<Float>(), -4, 4));

        c = BoundSubtendedDirections(b, p);
        if (Inside(p, b))
            EXPECT_EQ(std::cos(Pi), c.cosTheta);
        else {
            Vector3f wx, wy;
            CoordinateSystem(c.w, &wx, &wy);
            for (int j = 0; j < 1000; ++j) {
                Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
                Vector3f w = SampleUniformSphere(u);
                Ray r(p, w);
                bool hit = b.IntersectP(r.o, r.d);
                if (hit)
                    EXPECT_TRUE(Inside(c, w));
                if (!Inside(c, w))
                    EXPECT_FALSE(hit);
            }
        }
    }
}